

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedLinearAllocator.hpp
# Opt level: O1

void __thiscall
Diligent::FixedLinearAllocator::AddSpace(FixedLinearAllocator *this,size_t size,size_t alignment)

{
  size_t sVar1;
  long lVar2;
  char (*in_R8) [23];
  string msg;
  string local_48;
  size_t local_28;
  size_t local_20;
  ulong local_18;
  
  local_28 = alignment;
  local_20 = size;
  if (this->m_pDataStart != (uint8_t *)0x0) {
    FormatString<char[46]>(&local_48,(char (*) [46])"Memory has already been allocated or assigned")
    ;
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"AddSpace",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/FixedLinearAllocator.hpp"
               ,0x95);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  if ((local_28 ^ local_28 - 1) <= local_28 - 1) {
    FormatString<char[33]>(&local_48,(char (*) [33])"Alignment is not a power of two!");
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"AddSpace",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/FixedLinearAllocator.hpp"
               ,0x96);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_20 != 0) {
    if (this->m_CurrAlignment == 0) {
      if (this->m_ReservedSize != 0) {
        FormatString<char[60]>
                  (&local_48,
                   (char (*) [60])"This is expected to be a very first time the space is added");
        DebugAssertionFailed
                  (local_48._M_dataplus._M_p,"AddSpace",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/FixedLinearAllocator.hpp"
                   ,0x9d);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
        }
      }
      this->m_CurrAlignment = 8;
    }
    sVar1 = local_20;
    lVar2 = local_28 - this->m_CurrAlignment;
    if (this->m_CurrAlignment <= local_28 && lVar2 != 0) {
      this->m_ReservedSize = this->m_ReservedSize + lVar2;
    }
    this->m_CurrAlignment = local_28;
    local_18 = local_28;
    if ((local_28 ^ local_28 - 1) <= local_28 - 1) {
      FormatString<char[12],unsigned_long,char[23]>
                (&local_48,(Diligent *)"Alignment (",(char (*) [12])&local_18,
                 (unsigned_long *)") must be a power of 2",in_R8);
      DebugAssertionFailed
                (local_48._M_dataplus._M_p,"AlignUp",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Align.hpp"
                 ,0x34);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
    local_20 = -local_18 & (sVar1 + local_18) - 1;
    this->m_ReservedSize = this->m_ReservedSize + local_20;
    std::
    vector<Diligent::FixedLinearAllocator::DbgAllocationInfo,std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>>
    ::emplace_back<unsigned_long&,unsigned_long&,unsigned_long&>
              ((vector<Diligent::FixedLinearAllocator::DbgAllocationInfo,std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>>
                *)&this->m_DbgAllocations,&local_20,&local_28,&this->m_ReservedSize);
  }
  return;
}

Assistant:

void AddSpace(size_t size, size_t alignment = 1) noexcept
    {
        VERIFY(m_pDataStart == nullptr, "Memory has already been allocated or assigned");
        VERIFY(IsPowerOfTwo(alignment), "Alignment is not a power of two!");

        if (size == 0)
            return;

        if (m_CurrAlignment == 0)
        {
            VERIFY(m_ReservedSize == 0, "This is expected to be a very first time the space is added");
            m_CurrAlignment = sizeof(void*);
        }

        if (alignment > m_CurrAlignment)
        {
            // Reserve extra space that may be needed for alignment
            m_ReservedSize += alignment - m_CurrAlignment;
        }
        m_CurrAlignment = alignment;

        size = AlignUp(size, alignment);
        m_ReservedSize += size;

#if DILIGENT_DEBUG
        m_DbgAllocations.emplace_back(size, alignment, m_ReservedSize);
#endif
    }